

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultVerify.cpp
# Opt level: O0

void mult_verify::MultVerifyUint8Uint8(void)

{
  bool bVar1;
  string *unaff_retaddr;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si;
  bool fSuccess;
  uint8_t ret;
  size_t i;
  undefined7 in_stack_ffffffffffffff68;
  uchar in_stack_ffffffffffffff6f;
  allocator *in_stack_ffffffffffffff70;
  allocator local_69;
  string local_68 [34];
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_46;
  byte local_45;
  allocator local_31;
  string local_30 [39];
  undefined1 in_stack_fffffffffffffff7;
  ulong uVar2;
  
  for (uVar2 = 0; uVar2 < 0x73; uVar2 = uVar2 + 1) {
    bVar1 = SafeMultiply<unsigned_char,unsigned_char>
                      ((uchar)((ulong)in_stack_ffffffffffffff70 >> 0x38),
                       (uchar)((ulong)in_stack_ffffffffffffff70 >> 0x30),
                       (uchar *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    if (bVar1 != (bool)(uint8_uint8[uVar2 * 3 + 2] & 1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_30,"Error in case uint8_uint8: ",&local_31);
      err_msg<unsigned_int,unsigned_int>
                (unaff_retaddr,(uint)(uVar2 >> 0x20),(uint)uVar2,(bool)in_stack_fffffffffffffff7);
      std::__cxx11::string::~string(local_30);
      std::allocator<char>::~allocator((allocator<char> *)&local_31);
    }
    local_45 = 1;
    SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt(&local_46,uint8_uint8 + uVar2 * 3);
    SafeInt<unsigned_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator*=((SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6f);
    if ((local_45 & 1) != (uint8_uint8[uVar2 * 3 + 2] & 1)) {
      in_stack_ffffffffffffff70 = &local_69;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_68,"Error in case uint8_uint8 throw: ",in_stack_ffffffffffffff70);
      err_msg<unsigned_int,unsigned_int>
                (unaff_retaddr,(uint)(uVar2 >> 0x20),(uint)uVar2,(bool)in_stack_fffffffffffffff7);
      std::__cxx11::string::~string(local_68);
      std::allocator<char>::~allocator((allocator<char> *)&local_69);
    }
  }
  return;
}

Assistant:

void MultVerifyUint8Uint8()
{
	size_t i;

	for( i = 0; i < COUNTOF(uint8_uint8); ++i )
	{
		std::uint8_t ret;
		if( SafeMultiply(uint8_uint8[i].x, uint8_uint8[i].y, ret) != uint8_uint8[i].fExpected )
		{
			//assert(false);
			err_msg( "Error in case uint8_uint8: ", (unsigned int)uint8_uint8[i].x, (unsigned int)uint8_uint8[i].y, uint8_uint8[i].fExpected );
		}

		// Now test throwing version
		bool fSuccess = true;
		try
		{
			SafeInt<std::uint8_t> si(uint8_uint8[i].x);
			si *= uint8_uint8[i].y;
		}
		catch(...)
		{
			fSuccess = false;
		}

		if( fSuccess != uint8_uint8[i].fExpected )
		{
			err_msg( "Error in case uint8_uint8 throw: ", (unsigned int)uint8_uint8[i].x, (unsigned int)uint8_uint8[i].y, uint8_uint8[i].fExpected );
		}
	}
}